

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O3

void __thiscall TSMuxer::setMuxFormat(TSMuxer *this,string *format)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  uint8_t *puVar4;
  long lVar5;
  
  iVar1 = std::__cxx11::string::compare((char *)format);
  if (iVar1 == 0) {
LAB_001db6f1:
    this->m_m2tsMode = true;
    this->m_writeBlockSize = 0x200000;
    puVar4 = (uint8_t *)operator_new__(0x200400);
    this->m_outBuf = puVar4;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)format);
    if (iVar1 == 0) goto LAB_001db6f1;
    iVar1 = std::__cxx11::string::compare((char *)format);
    if (iVar1 == 0) goto LAB_001db6f1;
    iVar2 = std::__cxx11::string::compare((char *)format);
    this->m_m2tsMode = iVar2 == 0;
    iVar1 = 0x1ffff4;
    if (iVar2 == 0) {
      iVar1 = 0x200000;
    }
    this->m_writeBlockSize = iVar1;
    puVar4 = (uint8_t *)operator_new__((ulong)(iVar1 + 0x400));
    this->m_outBuf = puVar4;
    if (iVar2 != 0) {
      uVar3 = 0xbc;
      lVar5 = 0x149c;
      goto LAB_001db724;
    }
  }
  this->m_frameSize = 0xc0;
  uVar3 = 0x1800;
  lVar5 = 0x34;
LAB_001db724:
  *(undefined4 *)((long)&(this->super_AbstractMuxer)._vptr_AbstractMuxer + lVar5) = uVar3;
  return;
}

Assistant:

void TSMuxer::setMuxFormat(const std::string& format)
{
    m_m2tsMode = format == "M2TS" || format == "M2T" || format == "MTS" || format == "SSIF";
    m_writeBlockSize = m_m2tsMode ? DEFAULT_FILE_BLOCK_SIZE : TS188_ROUND_BLOCK_SIZE;
    m_outBuf = new uint8_t[m_writeBlockSize + 1024];
    m_frameSize = m_m2tsMode ? 192 : 188;
    if (m_m2tsMode)
        m_sectorSize = 1024 * 6;
}